

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O0

void __thiscall ON_Decal::CImpl::SetMapping(CImpl *this,Mappings m)

{
  ON_XMLVariant local_118;
  wchar_t *local_20;
  wchar_t *s;
  CImpl *pCStack_10;
  Mappings m_local;
  CImpl *this_local;
  
  if ((this->_cache).mapping != m) {
    (this->_cache).mapping = m;
    local_20 = L"";
    s._4_4_ = m;
    pCStack_10 = this;
    switch(m) {
    case Planar:
      local_20 = L"planar";
      break;
    case Cylindrical:
      local_20 = L"cylindrical";
      break;
    case Spherical:
      local_20 = L"spherical";
      break;
    case UV:
      local_20 = L"uv";
      break;
    default:
      ON_REMOVE_ASAP_AssertEx
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_decals.cpp"
                 ,0xa7,"","false is false");
    case None:
      local_20 = L"none";
    }
    ::ON_XMLVariant::ON_XMLVariant(&local_118,local_20);
    SetParameter(this,L"mapping",&local_118);
    ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  }
  return;
}

Assistant:

void ON_Decal::CImpl::SetMapping(Mappings m)
{
  if (_cache.mapping != m)
  {
    _cache.mapping = m;

    const wchar_t* s = L"";
    switch (m)
    {
    default: ON_ASSERT(false);
    case Mappings::None:        s = ON_RDK_DECAL_MAPPING_NONE;        break;
    case Mappings::Planar:      s = ON_RDK_DECAL_MAPPING_PLANAR;      break;
    case Mappings::Spherical:   s = ON_RDK_DECAL_MAPPING_SPHERICAL;   break;
    case Mappings::Cylindrical: s = ON_RDK_DECAL_MAPPING_CYLINDRICAL; break;
    case Mappings::UV:          s = ON_RDK_DECAL_MAPPING_UV;          break;
    }

    SetParameter(ON_RDK_DECAL_MAPPING, s);
  }
}